

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall lzham::symbol_codec::reset(symbol_codec *this)

{
  vector<lzham::symbol_codec::output_symbol> *in_RDI;
  bool grow_hint;
  uint new_size;
  vector<lzham::symbol_codec::output_symbol> *this_00;
  
  *(undefined8 *)&in_RDI->m_size = 0;
  in_RDI->m_malloc_context = (lzham_malloc_context)0x0;
  in_RDI[1].m_p = (output_symbol *)0x0;
  *(undefined8 *)&in_RDI[1].m_size = 0;
  in_RDI[2].m_malloc_context = (lzham_malloc_context)0x0;
  *(undefined4 *)&in_RDI[3].m_p = 0;
  *(undefined4 *)((long)&in_RDI[3].m_p + 4) = 0;
  *(undefined4 *)((long)&in_RDI[8].m_p + 4) = 0;
  in_RDI[6].m_size = 0;
  in_RDI[6].m_capacity = 0;
  *(undefined4 *)&in_RDI[6].m_malloc_context = 0;
  *(undefined4 *)((long)&in_RDI[6].m_malloc_context + 4) = 0;
  *(undefined4 *)&in_RDI[7].m_p = 0;
  new_size = (uint)((ulong)in_RDI >> 0x20);
  grow_hint = SUB81((ulong)in_RDI >> 0x18,0);
  this_00 = in_RDI;
  vector<unsigned_char>::try_resize((vector<unsigned_char> *)in_RDI,new_size,grow_hint);
  vector<unsigned_char>::try_resize((vector<unsigned_char> *)this_00,new_size,grow_hint);
  vector<lzham::symbol_codec::output_symbol>::try_resize(this_00,new_size,grow_hint);
  in_RDI[2].m_p = (output_symbol *)0x0;
  *(undefined8 *)&in_RDI[2].m_size = 0;
  *(undefined8 *)&in_RDI[7].m_size = 0;
  in_RDI[7].m_malloc_context = (lzham_malloc_context)0x0;
  *(undefined4 *)&in_RDI[8].m_p = 0;
  return;
}

Assistant:

void symbol_codec::reset()
   {
      m_pDecode_buf = NULL;
      m_pDecode_buf_next = NULL;
      m_pDecode_buf_end = NULL;
      m_decode_buf_size = 0;

      m_bit_buf = 0;
      m_bit_count = 0;
      m_total_model_updates = 0;
      m_mode = cNull;
      m_total_bits_written = 0;

      m_arith_base = 0;
      m_arith_value = 0;
      m_arith_length = 0;
      m_arith_total_bits = 0;

      m_output_buf.try_resize(0);
      m_arith_output_buf.try_resize(0);
      m_output_syms.try_resize(0);

      m_pDecode_need_bytes_func = NULL;
      m_pDecode_private_data = NULL;
      m_pSaved_huff_model = NULL;
      m_pSaved_model = NULL;
      m_saved_node_index = 0;
   }